

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwinsizes.cpp
# Opt level: O2

void change_pos_dim(Am_Drawonable *d)

{
  uint height;
  uint width;
  uint top;
  uint left;
  
  left = 999;
  puts("Changing POSITION/SIZE of blue window.  Enter four values");
  printf("  separated by spaces (or CTRL-D RETURN to exit): ");
  __isoc99_scanf("%d %d %d %d",&left,&top,&width,&height);
  getchar();
  if (left == 999) {
    putchar(10);
  }
  else {
    (**(code **)(*(long *)d + 0x50))(d,left,top);
    (**(code **)(*(long *)d + 0x58))(d,width,height);
    change_pos_dim(d);
  }
  return;
}

Assistant:

void
change_pos_dim(Am_Drawonable *d)
{

  unsigned int left, top, width, height;
  left = 999;

  printf("Changing POSITION/SIZE of blue window.  Enter four values\n");
  printf("  separated by spaces (or CTRL-D RETURN to exit): ");

  scanf("%d %d %d %d", &left, &top, &width, &height);
  getchar(); // Eat carriage return

  if (left == 999) {
    printf("\n");
    return;
  } else {
    d->Set_Position(left, top);
    d->Set_Size(width, height); // Does Flush_Output()
    print_win_info(d, "blue window");
    change_pos_dim(d);
  }
}